

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

int __thiscall jpgd::jpeg_decoder::decode(jpeg_decoder *this,void **pScan_line,uint *pScan_line_len)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  if (this->m_error_code != JPGD_SUCCESS) {
    return -1;
  }
  if (this->m_ready_flag != true) {
    return -1;
  }
  if (this->m_total_lines_left == 0) {
    return 1;
  }
  uVar3 = this->m_mcu_lines_left;
  if (uVar3 == 0) {
    iVar4 = _setjmp((__jmp_buf_tag *)this);
    if (iVar4 != 0) {
      return -1;
    }
    if (this->m_progressive_flag == 0) {
      decode_next_row(this);
    }
    else {
      load_next_row(this);
    }
    uVar3 = this->m_max_mcu_y_size;
    if (this->m_total_lines_left <= (int)uVar3) {
      find_eoi(this);
      uVar3 = this->m_max_mcu_y_size;
    }
    this->m_mcu_lines_left = uVar3;
  }
  if (this->m_freq_domain_chroma_upsample == true) {
    expanded_convert(this);
    goto LAB_00109825;
  }
  switch(this->m_scan_type) {
  case 0:
    gray_convert(this);
    break;
  case 1:
    H1V1Convert(this);
    break;
  case 2:
    H2V1Convert(this);
    break;
  case 3:
    lVar5 = 0x3540;
    if ((uVar3 & 1) == 0) {
      H1V2Convert(this);
      break;
    }
    goto LAB_0010982a;
  case 4:
    lVar5 = 0x3540;
    if ((uVar3 & 1) != 0) goto LAB_0010982a;
    H2V2Convert(this);
    break;
  default:
    goto switchD_00109875_default;
  }
LAB_00109825:
  lVar5 = 0x3538;
LAB_0010982a:
  *pScan_line = *(void **)((long)this->m_jmp_state[0].__jmpbuf + lVar5);
switchD_00109875_default:
  *pScan_line_len = this->m_real_dest_bytes_per_scan_line;
  uVar1 = this->m_total_lines_left;
  uVar2 = this->m_mcu_lines_left;
  this->m_total_lines_left = uVar1 + -1;
  this->m_mcu_lines_left = uVar2 + -1;
  return 0;
}

Assistant:

int jpeg_decoder::decode(const void** pScan_line, uint* pScan_line_len)
{
  if ((m_error_code) || (!m_ready_flag))
    return JPGD_FAILED;

  if (m_total_lines_left == 0)
    return JPGD_DONE;

  if (m_mcu_lines_left == 0)
  {
    if (setjmp(m_jmp_state))
      return JPGD_FAILED;

    if (m_progressive_flag)
      load_next_row();
    else
      decode_next_row();

    // Find the EOI marker if that was the last row.
    if (m_total_lines_left <= m_max_mcu_y_size)
      find_eoi();

    m_mcu_lines_left = m_max_mcu_y_size;
  }

  if (m_freq_domain_chroma_upsample)
  {
    expanded_convert();
    *pScan_line = m_pScan_line_0;
  }
  else
  {
    switch (m_scan_type)
    {
      case JPGD_YH2V2:
      {
        if ((m_mcu_lines_left & 1) == 0)
        {
          H2V2Convert();
          *pScan_line = m_pScan_line_0;
        }
        else
          *pScan_line = m_pScan_line_1;

        break;
      }
      case JPGD_YH2V1:
      {
        H2V1Convert();
        *pScan_line = m_pScan_line_0;
        break;
      }
      case JPGD_YH1V2:
      {
        if ((m_mcu_lines_left & 1) == 0)
        {
          H1V2Convert();
          *pScan_line = m_pScan_line_0;
        }
        else
          *pScan_line = m_pScan_line_1;

        break;
      }
      case JPGD_YH1V1:
      {
        H1V1Convert();
        *pScan_line = m_pScan_line_0;
        break;
      }
      case JPGD_GRAYSCALE:
      {
        gray_convert();
        *pScan_line = m_pScan_line_0;

        break;
      }
    }
  }

  *pScan_line_len = m_real_dest_bytes_per_scan_line;

  m_mcu_lines_left--;
  m_total_lines_left--;

  return JPGD_SUCCESS;
}